

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckEqualFailsOnNotEqual::RunImpl(TestCheckEqualFailsOnNotEqual *this)

{
  TestResults *pTVar1;
  bool bVar2;
  int iVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_8e8 [2];
  TestDetails local_8a8;
  int local_888 [2];
  undefined1 local_880 [8];
  ScopedCurrentTest scopedResults;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  bool failure;
  TestCheckEqualFailsOnNotEqual *this_local;
  
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_880,(TestResults *)local_860,(TestDetails *)0x0);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  local_888[1] = 1;
  local_888[0] = 2;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8a8,*ppTVar5,0x75);
  UnitTest::CheckEqual<int,int>(pTVar1,local_888 + 1,local_888,&local_8a8);
  iVar3 = UnitTest::TestResults::GetFailureCount((TestResults *)local_860);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_880);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  bVar2 = UnitTest::Check<bool>(0 < iVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_8e8,*ppTVar5,0x79);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_8e8,"failure");
  }
  return;
}

Assistant:

TEST(CheckEqualFailsOnNotEqual)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_EQUAL(1, 2);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}